

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse2.h
# Opt level: O2

void store_rect_buffer_16bit_to_32bit_w8(__m128i *in,int32_t *out,int stride,int out_size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  int32_t *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar11 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar1 = _DAT_004cc450;
  uVar3 = 0;
  uVar2 = (ulong)(uint)out_size;
  if (out_size < 1) {
    uVar2 = uVar3;
  }
  piVar4 = out + 4;
  for (; uVar2 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    auVar6 = *(undefined1 (*) [16])((long)*in + uVar3);
    auVar10._0_12_ = auVar6._0_12_;
    auVar10._12_2_ = auVar6._6_2_;
    auVar10._14_2_ = 1;
    auVar9._12_4_ = auVar10._12_4_;
    auVar9._0_10_ = auVar6._0_10_;
    auVar9._10_2_ = 1;
    auVar8._10_6_ = auVar9._10_6_;
    auVar8._0_8_ = auVar6._0_8_;
    auVar8._8_2_ = auVar6._4_2_;
    auVar7._8_8_ = auVar8._8_8_;
    auVar7._0_8_ = 0x1000000000000;
    auVar11._6_10_ = auVar7._6_10_;
    auVar11._4_2_ = auVar6._2_2_;
    auVar11._0_2_ = auVar6._0_2_;
    auVar11._2_2_ = 1;
    auVar5._2_2_ = 0;
    auVar5._0_2_ = auVar6._8_2_;
    auVar5._4_2_ = auVar6._10_2_;
    auVar5._6_2_ = 0;
    auVar5._8_2_ = auVar6._12_2_;
    auVar5._10_2_ = 0;
    auVar5._12_2_ = auVar6._14_2_;
    auVar5._14_2_ = 1;
    auVar11 = pmaddwd(auVar11,auVar1);
    auVar6 = pmaddwd(auVar5,auVar1);
    piVar4[-4] = auVar11._0_4_ >> 0xc;
    piVar4[-3] = auVar11._4_4_ >> 0xc;
    piVar4[-2] = auVar11._8_4_ >> 0xc;
    piVar4[-1] = auVar11._12_4_ >> 0xc;
    *piVar4 = auVar6._0_4_ >> 0xc;
    piVar4[1] = auVar6._4_4_ >> 0xc;
    piVar4[2] = auVar6._8_4_ >> 0xc;
    piVar4[3] = auVar6._12_4_ >> 0xc;
    piVar4 = piVar4 + stride;
  }
  return;
}

Assistant:

static inline void store_rect_buffer_16bit_to_32bit_w8(const __m128i *const in,
                                                       int32_t *const out,
                                                       const int stride,
                                                       const int out_size) {
  for (int i = 0; i < out_size; ++i) {
    store_rect_16bit_to_32bit(in[i], out + i * stride);
  }
}